

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

_Bool dns_get_inet_qtype(char *buf,size_t len,uint16_t *qtype)

{
  byte bVar1;
  dns_header_t *hdr;
  byte *pbVar2;
  
  if ((0xc < len) && (*(short *)(buf + 4) != 0)) {
    pbVar2 = (byte *)(buf + 0xc);
    bVar1 = buf[0xc];
    while (bVar1 != 0) {
      if (0xbf < bVar1) {
        pbVar2 = pbVar2 + 2;
        goto LAB_00107cf1;
      }
      pbVar2 = pbVar2 + (ulong)bVar1 + 1;
      bVar1 = *pbVar2;
    }
    pbVar2 = pbVar2 + 1;
LAB_00107cf1:
    if (*(short *)(pbVar2 + 2) == 0x100) {
      *qtype = 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool dns_get_inet_qtype(const char * buf, size_t len, uint16_t * qtype)
{
    struct dns_header_t * hdr = (struct dns_header_t *)buf;
    const char * p = (const char *)hdr;

    if (len <= sizeof(*hdr) || ntohs(hdr->qdcount) == 0)
        return false;
    
    // skip header
    p += sizeof(*hdr);
    // skip QNAME
    p = _dns_skip_qname(p);
    // skip QTYPE
    if (*(uint16_t *)(p += sizeof(uint16_t)) == htons(CLASS_IN)) {
        * qtype = ntohs(*(uint16_t *)p);
        return true;
    }
    return false;
}